

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catmullclark_patch.h
# Opt level: O2

void __thiscall
embree::GeneralCatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>::subdivide
          (GeneralCatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa> *this,
          array_t<embree::CatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>,_16UL> *patch,uint *N_o
          )

{
  DynamicStackArray<float,_16UL,_64UL> *pDVar1;
  uint *puVar2;
  undefined8 *puVar3;
  Vec3fa *pVVar4;
  undefined8 *puVar5;
  int iVar6;
  GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa> *pGVar7;
  Face *pFVar8;
  GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa> *pGVar9;
  long *plVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 uVar13;
  long lVar14;
  long lVar15;
  undefined8 uVar16;
  array_t<embree::CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>,_4UL> *paVar17;
  size_t i;
  Vec3fa *pVVar18;
  long lVar19;
  float *pfVar20;
  size_t k;
  ulong uVar21;
  Vec3fa **ppVVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  uint uVar28;
  DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *pDVar29;
  DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *pDVar30;
  DynamicStackArray<float,_16UL,_64UL> *pDVar31;
  ulong uVar32;
  uint uVar33;
  uint i_3;
  CatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa> *pCVar34;
  ulong uVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar44;
  float fVar45;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  Vec3fa VVar43;
  float fVar46;
  undefined1 auVar47 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  ulong local_2e0;
  DynamicStackArray<float,_16UL,_64UL> *local_2d8;
  undefined8 uStack_2d0;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  array_t<embree::Vec3fa,_32UL> center_ring;
  
  uVar26 = this->N;
  *N_o = uVar26;
  pDVar30 = &patch->items[0].ring.items[0].ring;
  pDVar31 = &patch->items[0].ring.items[0].crease_weight;
  uVar32 = 0;
  while( true ) {
    if (uVar26 <= uVar32) break;
    uVar35 = uVar32 + 1;
    pGVar7 = (this->ring).data;
    pGVar9 = pGVar7 + uVar32;
    pCVar34 = patch->items + uVar32;
    pDVar29 = &(pCVar34->ring).items[0].ring;
    (pCVar34->ring).items[0].edge_level = pGVar7[uVar32].edge_level * 0.5;
    (pCVar34->ring).items[0].vertex_level = pGVar7[uVar32].vertex_level * 0.5;
    uVar33 = pGVar7[uVar32].face_valence;
    (pCVar34->ring).items[0].face_valence = uVar33;
    (pCVar34->ring).items[0].edge_valence = uVar33 * 2;
    iVar6 = pGVar7[uVar32].border_face * 2;
    if (pGVar7[uVar32].border_face == -1) {
      iVar6 = -1;
    }
    (pCVar34->ring).items[0].border_index = iVar6;
    fVar36 = pGVar7[uVar32].vertex_crease_weight + -1.0;
    if (fVar36 <= 0.0) {
      fVar36 = 0.0;
    }
    (pCVar34->ring).items[0].vertex_crease_weight = fVar36;
    (pCVar34->ring).items[0].eval_start_index = pGVar7[uVar32].eval_start_face_index;
    (pCVar34->ring).items[0].eval_unique_identifier = pGVar7[uVar32].eval_unique_identifier;
    uVar24 = (ulong)pGVar7[uVar32].eval_start_vertex_index;
    fVar36 = 0.0;
    fVar49 = 0.0;
    fVar50 = 0.0;
    fVar51 = 0.0;
    for (uVar27 = 0; uVar23 = (ulong)pGVar9->face_valence, uVar27 < uVar23; uVar27 = uVar27 + 1) {
      uVar23 = (pGVar9->eval_start_face_index + uVar27) % uVar23;
      iVar6 = (pGVar9->faces).data[uVar23].size;
      auVar41 = *(undefined1 (*) [16])(pGVar9->vtx).field_0.m128;
      for (uVar21 = uVar24; uVar21 <= (long)iVar6 + uVar24; uVar21 = uVar21 + 1) {
        pVVar18 = (pGVar9->ring).data + uVar21 % (ulong)pGVar9->edge_valence;
        auVar42._0_4_ = auVar41._0_4_ + (pVVar18->field_0).m128[0];
        auVar42._4_4_ = auVar41._4_4_ + (pVVar18->field_0).m128[1];
        auVar42._8_4_ = auVar41._8_4_ + (pVVar18->field_0).m128[2];
        auVar42._12_4_ = auVar41._12_4_ + (pVVar18->field_0).m128[3];
        auVar41 = auVar42;
      }
      pVVar18 = patch->items[uVar32].ring.items[0].ring.data;
      if ((0xf < uVar23) && ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar18 == pDVar29))
      {
        local_2d8 = pDVar31;
        pVVar18 = (Vec3fa *)Vec3fa::operator_new__(0x800);
        patch->items[uVar32].ring.items[0].ring.data = pVVar18;
        for (lVar19 = 0; lVar19 != 0x200; lVar19 = lVar19 + 0x10) {
          puVar5 = (undefined8 *)((long)&pDVar30->arr[0].field_0 + lVar19);
          uVar13 = puVar5[1];
          puVar3 = (undefined8 *)
                   ((long)&(patch->items[uVar32].ring.items[0].ring.data)->field_0 + lVar19);
          *puVar3 = *puVar5;
          puVar3[1] = uVar13;
        }
        pVVar18 = patch->items[uVar32].ring.items[0].ring.data;
      }
      fVar37 = (float)(iVar6 + 2);
      auVar11._4_4_ = fVar37;
      auVar11._0_4_ = fVar37;
      auVar11._8_4_ = fVar37;
      auVar11._12_4_ = fVar37;
      VVar43.field_0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)divps(auVar41,auVar11);
      pVVar18[uVar23 * 2 + 1].field_0 = VVar43.field_0;
      fVar36 = fVar36 + VVar43.field_0._0_4_;
      fVar49 = fVar49 + VVar43.field_0._4_4_;
      fVar50 = fVar50 + VVar43.field_0._8_4_;
      fVar51 = fVar51 + VVar43.field_0._12_4_;
      uVar24 = (uVar24 + (long)(pGVar9->faces).data[uVar23].size) % (ulong)pGVar9->edge_valence;
    }
    uVar24 = (ulong)pGVar9->eval_start_vertex_index;
    pDVar1 = &patch->items[uVar32].ring.items[0].crease_weight;
    local_2b8 = 0.0;
    fStack_2b4 = 0.0;
    fStack_2b0 = 0.0;
    fStack_2ac = 0.0;
    uVar27 = 0;
    local_2e0 = 0;
    while( true ) {
      uVar16 = center_ring.items[0].field_0._8_8_;
      uVar13 = center_ring.items[0].field_0._0_8_;
      fVar37 = (pGVar9->vtx).field_0.m128[0];
      fVar52 = (pGVar9->vtx).field_0.m128[1];
      fVar53 = (pGVar9->vtx).field_0.m128[2];
      fVar54 = (pGVar9->vtx).field_0.m128[3];
      if (uVar23 <= uVar27) break;
      uVar23 = (pGVar9->eval_start_face_index + uVar27) % uVar23;
      pVVar18 = (pGVar9->ring).data + uVar24;
      fVar37 = fVar37 + (pVVar18->field_0).m128[0];
      fVar52 = fVar52 + (pVVar18->field_0).m128[1];
      fVar53 = fVar53 + (pVVar18->field_0).m128[2];
      fVar54 = fVar54 + (pVVar18->field_0).m128[3];
      uVar21 = uVar23 * 2 + 1;
      pVVar18 = patch->items[uVar32].ring.items[0].ring.data;
      if (uVar23 < 0x10) {
LAB_005effd8:
        pVVar4 = pVVar18 + uVar21;
        fVar39 = (pVVar4->field_0).m128[0];
        fVar44 = (pVVar4->field_0).m128[1];
        fVar45 = (pVVar4->field_0).m128[2];
        fVar46 = (pVVar4->field_0).m128[3];
        if (uVar23 != 0) goto LAB_005effe8;
        uVar33 = patch->items[uVar32].ring.items[0].edge_valence;
        if ((0x20 < uVar33) &&
           ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar18 == pDVar29)) {
          local_2d8 = pDVar31;
          pVVar18 = (Vec3fa *)Vec3fa::operator_new__(0x800);
          patch->items[uVar32].ring.items[0].ring.data = pVVar18;
          for (lVar19 = 0; lVar19 != 0x200; lVar19 = lVar19 + 0x10) {
            puVar5 = (undefined8 *)((long)&pDVar30->arr[0].field_0 + lVar19);
            uVar13 = puVar5[1];
            puVar3 = (undefined8 *)
                     ((long)&(patch->items[uVar32].ring.items[0].ring.data)->field_0 + lVar19);
            *puVar3 = *puVar5;
            puVar3[1] = uVar13;
          }
          pVVar18 = patch->items[uVar32].ring.items[0].ring.data;
        }
        pVVar18 = pVVar18 + (uVar33 - 1);
      }
      else {
        if ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar18 == pDVar29) {
          local_2d8 = pDVar31;
          pVVar18 = (Vec3fa *)Vec3fa::operator_new__(0x800);
          patch->items[uVar32].ring.items[0].ring.data = pVVar18;
          for (lVar19 = 0; lVar19 != 0x200; lVar19 = lVar19 + 0x10) {
            puVar5 = (undefined8 *)((long)&pDVar30->arr[0].field_0 + lVar19);
            uVar13 = puVar5[1];
            puVar3 = (undefined8 *)
                     ((long)&(patch->items[uVar32].ring.items[0].ring.data)->field_0 + lVar19);
            *puVar3 = *puVar5;
            puVar3[1] = uVar13;
          }
          pVVar18 = patch->items[uVar32].ring.items[0].ring.data;
          goto LAB_005effd8;
        }
        pVVar4 = pVVar18 + uVar21;
        fVar39 = (pVVar4->field_0).m128[0];
        fVar44 = (pVVar4->field_0).m128[1];
        fVar45 = (pVVar4->field_0).m128[2];
        fVar46 = (pVVar4->field_0).m128[3];
LAB_005effe8:
        if ((0x10 < uVar23) &&
           ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar18 == pDVar29)) {
          local_2d8 = pDVar31;
          pVVar18 = (Vec3fa *)Vec3fa::operator_new__(0x800);
          patch->items[uVar32].ring.items[0].ring.data = pVVar18;
          for (lVar19 = 0; lVar19 != 0x200; lVar19 = lVar19 + 0x10) {
            puVar5 = (undefined8 *)((long)&pDVar30->arr[0].field_0 + lVar19);
            uVar13 = puVar5[1];
            puVar3 = (undefined8 *)
                     ((long)&(patch->items[uVar32].ring.items[0].ring.data)->field_0 + lVar19);
            *puVar3 = *puVar5;
            puVar3[1] = uVar13;
          }
          pVVar18 = patch->items[uVar32].ring.items[0].ring.data;
        }
        pVVar18 = pVVar18 + uVar23 * 2 + -1;
      }
      fVar39 = fVar39 + (pVVar18->field_0).m128[0];
      fVar44 = fVar44 + (pVVar18->field_0).m128[1];
      fVar45 = fVar45 + (pVVar18->field_0).m128[2];
      fVar46 = fVar46 + (pVVar18->field_0).m128[3];
      pVVar18 = (pGVar9->ring).data + uVar24;
      fVar36 = fVar36 + (pVVar18->field_0).m128[0];
      fVar49 = fVar49 + (pVVar18->field_0).m128[1];
      fVar50 = fVar50 + (pVVar18->field_0).m128[2];
      fVar51 = fVar51 + (pVVar18->field_0).m128[3];
      local_2d8._0_4_ = (pGVar9->faces).data[uVar23].crease_weight + -1.0;
      auVar41 = _local_2d8;
      pfVar20 = patch->items[uVar32].ring.items[0].crease_weight.data;
      if ((0xf < uVar23) && ((DynamicStackArray<float,_16UL,_64UL> *)pfVar20 == pDVar1)) {
        pfVar20 = (float *)operator_new__(0x100);
        patch->items[uVar32].ring.items[0].crease_weight.data = pfVar20;
        for (lVar19 = 0; lVar19 != 0x10; lVar19 = lVar19 + 1) {
          patch->items[uVar32].ring.items[0].crease_weight.data[lVar19] = pDVar31->arr[lVar19];
        }
        pfVar20 = patch->items[uVar32].ring.items[0].crease_weight.data;
      }
      fVar38 = 0.0;
      if (0.0 <= local_2d8._0_4_) {
        fVar38 = local_2d8._0_4_;
      }
      pfVar20[uVar23] = fVar38;
      if (0.0 < (pGVar9->faces).data[uVar23].crease_weight) {
        pVVar18 = (pGVar9->ring).data + uVar24;
        local_2b8 = local_2b8 + (pVVar18->field_0).m128[0];
        fStack_2b4 = fStack_2b4 + (pVVar18->field_0).m128[1];
        fStack_2b0 = fStack_2b0 + (pVVar18->field_0).m128[2];
        fStack_2ac = fStack_2ac + (pVVar18->field_0).m128[3];
        *(ulong *)((long)&center_ring.items[0].field_0 + local_2e0 * 8) = uVar23;
        pVVar18 = patch->items[uVar32].ring.items[0].ring.data;
        if ((0x20 < uVar21) &&
           ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar18 == pDVar29)) {
          local_2d8 = pDVar31;
          pVVar18 = (Vec3fa *)Vec3fa::operator_new__(0x800);
          patch->items[uVar32].ring.items[0].ring.data = pVVar18;
          for (lVar19 = 0; lVar19 != 0x200; lVar19 = lVar19 + 0x10) {
            puVar5 = (undefined8 *)((long)&pDVar30->arr[0].field_0 + lVar19);
            uVar13 = puVar5[1];
            puVar3 = (undefined8 *)
                     ((long)&(patch->items[uVar32].ring.items[0].ring.data)->field_0 + lVar19);
            *puVar3 = *puVar5;
            puVar3[1] = uVar13;
          }
          pVVar18 = patch->items[uVar32].ring.items[0].ring.data;
          auVar41 = _local_2d8;
        }
        _local_2d8 = auVar41;
        local_2e0 = local_2e0 + 1;
        pVVar18 = pVVar18 + uVar23 * 2;
        (pVVar18->field_0).m128[0] = fVar37 * 0.5;
        (pVVar18->field_0).m128[1] = fVar52 * 0.5;
        (pVVar18->field_0).m128[2] = fVar53 * 0.5;
        (pVVar18->field_0).m128[3] = fVar54 * 0.5;
        fVar38 = (pGVar9->faces).data[uVar23].crease_weight;
        if (fVar38 < 1.0) {
          fVar40 = 1.0 - fVar38;
          local_298 = (fVar37 + fVar39) * 0.25 * fVar40 + fVar37 * 0.5 * fVar38;
          fStack_294 = (fVar52 + fVar44) * 0.25 * fVar40 + fVar52 * 0.5 * fVar38;
          fStack_290 = (fVar53 + fVar45) * 0.25 * fVar40 + fVar53 * 0.5 * fVar38;
          fStack_28c = (fVar54 + fVar46) * 0.25 * fVar40 + fVar54 * 0.5 * fVar38;
          pVVar18 = patch->items[uVar32].ring.items[0].ring.data;
          auVar41 = _local_2d8;
          if (0x20 < uVar21) {
            local_2d8 = pDVar31;
            if ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar18 == pDVar29) {
              pVVar18 = (Vec3fa *)Vec3fa::operator_new__(0x800);
              patch->items[uVar32].ring.items[0].ring.data = pVVar18;
              for (lVar19 = 0; lVar19 != 0x200; lVar19 = lVar19 + 0x10) {
                puVar5 = (undefined8 *)((long)&pDVar30->arr[0].field_0 + lVar19);
                uVar13 = puVar5[1];
                puVar3 = (undefined8 *)
                         ((long)&(patch->items[uVar32].ring.items[0].ring.data)->field_0 + lVar19);
                *puVar3 = *puVar5;
                puVar3[1] = uVar13;
              }
              goto LAB_005f0857;
            }
            goto LAB_005f08c1;
          }
          goto LAB_005f0091;
        }
      }
      else {
        local_298 = (fVar37 + fVar39) * 0.25;
        fStack_294 = (fVar52 + fVar44) * 0.25;
        fStack_290 = (fVar53 + fVar45) * 0.25;
        fStack_28c = (fVar54 + fVar46) * 0.25;
        pVVar18 = patch->items[uVar32].ring.items[0].ring.data;
        if ((0x20 < uVar21) &&
           ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar18 == pDVar29)) {
          local_2d8 = pDVar31;
          pVVar18 = (Vec3fa *)Vec3fa::operator_new__(0x800);
          patch->items[uVar32].ring.items[0].ring.data = pVVar18;
          for (lVar19 = 0; lVar19 != 0x200; lVar19 = lVar19 + 0x10) {
            puVar5 = (undefined8 *)((long)&pDVar30->arr[0].field_0 + lVar19);
            uVar13 = puVar5[1];
            puVar3 = (undefined8 *)
                     ((long)&(patch->items[uVar32].ring.items[0].ring.data)->field_0 + lVar19);
            *puVar3 = *puVar5;
            puVar3[1] = uVar13;
          }
LAB_005f0857:
          pVVar18 = patch->items[uVar32].ring.items[0].ring.data;
          pDVar31 = local_2d8;
LAB_005f08c1:
          auVar41 = _local_2d8;
        }
LAB_005f0091:
        _local_2d8 = auVar41;
        pVVar18 = pVVar18 + uVar23 * 2;
        (pVVar18->field_0).m128[0] = local_298;
        (pVVar18->field_0).m128[1] = fStack_294;
        (pVVar18->field_0).m128[2] = fStack_290;
        (pVVar18->field_0).m128[3] = fStack_28c;
      }
      uVar24 = (uVar24 + (long)(pGVar9->faces).data[uVar23].size) % (ulong)pGVar9->edge_valence;
      uVar27 = uVar27 + 1;
      uVar23 = (ulong)pGVar9->face_valence;
    }
    fVar44 = 1.0 / (float)uVar23;
    fVar39 = (float)uVar23 + -2.0;
    fVar37 = (fVar36 * fVar44 + fVar39 * fVar37) * fVar44;
    fVar49 = (fVar49 * fVar44 + fVar39 * fVar52) * fVar44;
    fVar50 = (fVar50 * fVar44 + fVar39 * fVar53) * fVar44;
    fVar44 = (fVar51 * fVar44 + fVar39 * fVar54) * fVar44;
    patch->items[uVar32].ring.items[0].vtx.field_0.m128[0] = fVar37;
    patch->items[uVar32].ring.items[0].vtx.field_0.m128[1] = fVar49;
    patch->items[uVar32].ring.items[0].vtx.field_0.m128[2] = fVar50;
    patch->items[uVar32].ring.items[0].vtx.field_0.m128[3] = fVar44;
    fVar36 = pGVar9->vertex_crease_weight;
    if (0.0 < fVar36) {
      if (1.0 <= fVar36) {
        fVar51 = (pGVar9->vtx).field_0.m128[0];
        fVar52 = (pGVar9->vtx).field_0.m128[1];
        fVar53 = (pGVar9->vtx).field_0.m128[2];
        fVar36 = (pGVar9->vtx).field_0.m128[3];
      }
      else {
        fVar54 = 1.0 - fVar36;
        fVar51 = fVar54 * (pGVar9->vtx).field_0.m128[0] + fVar37 * fVar36;
        fVar52 = fVar54 * (pGVar9->vtx).field_0.m128[1] + fVar49 * fVar36;
        fVar53 = fVar54 * (pGVar9->vtx).field_0.m128[2] + fVar50 * fVar36;
        fVar36 = fVar54 * (pGVar9->vtx).field_0.m128[3] + fVar44 * fVar36;
      }
LAB_005f0ae2:
      patch->items[uVar32].ring.items[0].vtx.field_0.m128[0] = fVar51;
      patch->items[uVar32].ring.items[0].vtx.field_0.m128[1] = fVar52;
      patch->items[uVar32].ring.items[0].vtx.field_0.m128[2] = fVar53;
      patch->items[uVar32].ring.items[0].vtx.field_0.m128[3] = fVar36;
    }
    else if (1 < local_2e0) {
      fVar51 = (pGVar9->vtx).field_0.m128[0];
      fVar52 = (pGVar9->vtx).field_0.m128[1];
      fVar53 = (pGVar9->vtx).field_0.m128[2];
      fVar36 = (pGVar9->vtx).field_0.m128[3];
      if (local_2e0 == 2) {
        fVar54 = (local_2b8 + fVar51 * 6.0) * 0.125;
        fVar39 = (fStack_2b4 + fVar52 * 6.0) * 0.125;
        fVar53 = (fStack_2b0 + fVar53 * 6.0) * 0.125;
        fVar45 = (fStack_2ac + fVar36 * 6.0) * 0.125;
        pFVar8 = (pGVar9->faces).data;
        fVar36 = pFVar8[center_ring.items[0].field_0._0_8_].crease_weight;
        fVar51 = pFVar8[center_ring.items[0].field_0._8_8_].crease_weight;
        patch->items[uVar32].ring.items[0].vtx.field_0.m128[0] = fVar54;
        patch->items[uVar32].ring.items[0].vtx.field_0.m128[1] = fVar39;
        patch->items[uVar32].ring.items[0].vtx.field_0.m128[2] = fVar53;
        patch->items[uVar32].ring.items[0].vtx.field_0.m128[3] = fVar45;
        fVar52 = (fVar36 * 3.0 + fVar51) * 0.25 + -1.0;
        pfVar20 = patch->items[uVar32].ring.items[0].crease_weight.data;
        if ((0x10 < center_ring.items[0].field_0._0_8_ + 1) &&
           ((DynamicStackArray<float,_16UL,_64UL> *)pfVar20 == pDVar1)) {
          pfVar20 = (float *)operator_new__(0x100);
          patch->items[uVar32].ring.items[0].crease_weight.data = pfVar20;
          for (lVar19 = 0; lVar19 != 0x10; lVar19 = lVar19 + 1) {
            patch->items[uVar32].ring.items[0].crease_weight.data[lVar19] = pDVar31->arr[lVar19];
          }
          pfVar20 = patch->items[uVar32].ring.items[0].crease_weight.data;
        }
        fVar46 = 0.0;
        if (0.0 <= fVar52) {
          fVar46 = fVar52;
        }
        pfVar20[uVar13] = fVar46;
        local_2d8._0_4_ = (fVar51 * 3.0 + fVar36) * 0.25 + -1.0;
        pfVar20 = patch->items[uVar32].ring.items[0].crease_weight.data;
        if ((0x10 < uVar16 + 1) && ((DynamicStackArray<float,_16UL,_64UL> *)pfVar20 == pDVar1)) {
          pfVar20 = (float *)operator_new__(0x100);
          patch->items[uVar32].ring.items[0].crease_weight.data = pfVar20;
          for (lVar19 = 0; lVar19 != 0x10; lVar19 = lVar19 + 1) {
            patch->items[uVar32].ring.items[0].crease_weight.data[lVar19] = pDVar31->arr[lVar19];
          }
          pfVar20 = patch->items[uVar32].ring.items[0].crease_weight.data;
        }
        fVar52 = 0.0;
        if (0.0 <= local_2d8._0_4_) {
          fVar52 = local_2d8._0_4_;
        }
        pfVar20[uVar16] = fVar52;
        fVar36 = (fVar36 + fVar51) * 0.5;
        if (1.0 <= fVar36) goto LAB_005f093c;
        fVar46 = 1.0 - fVar36;
        fVar51 = fVar54 * fVar46 + fVar37 * fVar36;
        fVar52 = fVar39 * fVar46 + fVar49 * fVar36;
        fVar53 = fVar53 * fVar46 + fVar50 * fVar36;
        fVar36 = fVar45 * fVar46 + fVar44 * fVar36;
      }
      goto LAB_005f0ae2;
    }
LAB_005f093c:
    patch->items[uVar32].ring.items[0].edge_level = (this->ring).data[uVar32].edge_level * 0.5;
    uVar24 = 0;
    if (uVar35 != uVar26) {
      uVar24 = uVar35 & 0xffffffff;
    }
    patch->items[uVar24].ring.items[3].edge_level = (this->ring).data[uVar32].edge_level * 0.5;
    uVar26 = this->N;
    pDVar30 = (DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)((long)(pDVar30 + 5) + 0x1c0);
    pDVar31 = pDVar31 + 0x1a;
    uVar32 = uVar35;
  }
  ppVVar22 = &patch->items[0].ring.items[1].ring.data;
  uVar33 = 1;
  lVar19 = 0;
  uVar32 = 0;
  auVar41 = ZEXT816(0);
  fVar36 = 2.0;
  do {
    uVar35 = (ulong)uVar26;
    if (uVar35 <= uVar32) {
      fVar49 = (float)uVar35;
      auVar12._4_4_ = fVar49;
      auVar12._0_4_ = fVar49;
      auVar12._8_4_ = fVar49;
      auVar12._12_4_ = fVar49;
      aVar48 = (anon_union_16_2_47237d3f_for_Vec3fa_0)divps(auVar41,auVar12);
      pDVar30 = &patch->items[0].ring.items[2].ring;
      pDVar31 = &patch->items[0].ring.items[2].crease_weight;
      for (uVar32 = 0; uVar32 < uVar26; uVar32 = uVar32 + 1) {
        patch->items[uVar32].ring.items[2].vertex_level = fVar36;
        patch->items[uVar32].ring.items[2].face_valence = uVar26;
        uVar33 = uVar26 * 2;
        patch->items[uVar32].ring.items[2].edge_valence = uVar33;
        patch->items[uVar32].ring.items[2].border_index = -1;
        patch->items[uVar32].ring.items[2].vtx.field_0 = aVar48;
        patch->items[uVar32].ring.items[2].vertex_crease_weight = 0.0;
        for (uVar35 = 0; uVar35 != uVar33; uVar35 = uVar35 + 1) {
          uVar24 = (ulong)(uVar33 + (int)uVar32 * 2 + -1 + (int)uVar35) % (ulong)uVar33;
          fVar49 = center_ring.items[uVar24].field_0.m128[0];
          fVar50 = center_ring.items[uVar24].field_0.m128[1];
          fVar51 = center_ring.items[uVar24].field_0.m128[2];
          fVar37 = center_ring.items[uVar24].field_0.m128[3];
          pVVar18 = patch->items[uVar32].ring.items[2].ring.data;
          if ((0x1f < uVar35) &&
             ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar18 ==
              &patch->items[uVar32].ring.items[2].ring)) {
            pVVar18 = (Vec3fa *)Vec3fa::operator_new__(0x800);
            patch->items[uVar32].ring.items[2].ring.data = pVVar18;
            for (lVar19 = 0; lVar19 != 0x200; lVar19 = lVar19 + 0x10) {
              puVar5 = (undefined8 *)((long)&pDVar30->arr[0].field_0 + lVar19);
              uVar13 = puVar5[1];
              puVar3 = (undefined8 *)
                       ((long)&(patch->items[uVar32].ring.items[2].ring.data)->field_0 + lVar19);
              *puVar3 = *puVar5;
              puVar3[1] = uVar13;
            }
            pVVar18 = patch->items[uVar32].ring.items[2].ring.data;
          }
          pVVar18 = pVVar18 + uVar35;
          (pVVar18->field_0).m128[0] = fVar49;
          (pVVar18->field_0).m128[1] = fVar50;
          (pVVar18->field_0).m128[2] = fVar51;
          (pVVar18->field_0).m128[3] = fVar37;
        }
        for (uVar35 = 0; uVar35 != uVar26; uVar35 = uVar35 + 1) {
          pfVar20 = patch->items[uVar32].ring.items[2].crease_weight.data;
          if ((0xf < uVar35) &&
             ((DynamicStackArray<float,_16UL,_64UL> *)pfVar20 ==
              &patch->items[uVar32].ring.items[2].crease_weight)) {
            pfVar20 = (float *)operator_new__(0x100);
            patch->items[uVar32].ring.items[2].crease_weight.data = pfVar20;
            for (lVar19 = 0; lVar19 != 0x10; lVar19 = lVar19 + 1) {
              patch->items[uVar32].ring.items[2].crease_weight.data[lVar19] = pDVar31->arr[lVar19];
            }
            pfVar20 = patch->items[uVar32].ring.items[2].crease_weight.data;
          }
          pfVar20[uVar35] = 0.0;
        }
        uVar26 = uVar33 + (int)uVar32 * -2 >> 1;
        patch->items[uVar32].ring.items[2].eval_start_index = uVar26;
        puVar2 = &patch->items[uVar32].ring.items[2].face_valence;
        if (*puVar2 <= uVar26) {
          patch->items[uVar32].ring.items[2].eval_start_index = uVar26 - *puVar2;
        }
        patch->items[uVar32].ring.items[2].eval_unique_identifier = 0;
        uVar26 = this->N;
        pDVar30 = (DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)((long)(pDVar30 + 5) + 0x1c0);
        pDVar31 = pDVar31 + 0x1a;
      }
      return;
    }
    uVar27 = uVar32 + 1;
    pGVar9 = (this->ring).data;
    uVar24 = 0;
    if (uVar27 != uVar35) {
      uVar24 = uVar27 & 0xffffffff;
    }
    if ((*(int *)((long)&pGVar9->border_face + lVar19) ==
         *(int *)((long)&pGVar9->face_valence + lVar19) + -1) || (pGVar9[uVar24].face_valence < 3))
    {
      *(float *)(ppVVar22 + -0x48) = *(float *)((long)ppVVar22 + -0x57c);
      patch->items[uVar24].ring.items[3].vertex_level = *(float *)((long)ppVVar22 + -0x57c);
      *(undefined4 *)((long)ppVVar22 + -0x2fc) = 3;
      patch->items[uVar24].ring.items[3].face_valence = 3;
      *(undefined4 *)(ppVVar22 + -0x5f) = 6;
      patch->items[uVar24].ring.items[3].edge_valence = 6;
      *(undefined4 *)(ppVVar22 + -0x60) = 2;
      patch->items[uVar24].ring.items[3].border_index = 4;
      plVar10 = (long *)ppVVar22[-0x68];
      lVar14 = *plVar10;
      lVar15 = plVar10[1];
      ppVVar22[-0x46] = (Vec3fa *)lVar14;
      ppVVar22[-0x45] = (Vec3fa *)lVar15;
      paVar17 = &patch->items[uVar24].ring;
      *(long *)&paVar17->items[3].vtx.field_0 = lVar14;
      *(long *)((long)&paVar17->items[3].vtx.field_0 + 8) = lVar15;
      *(undefined4 *)((long)ppVVar22 + -0x2f4) = 0;
      patch->items[uVar24].ring.items[3].vertex_crease_weight = 0.0;
      lVar14 = plVar10[2];
      lVar15 = plVar10[3];
      pVVar18 = *ppVVar22;
      *(long *)&pVVar18->field_0 = lVar14;
      *(long *)((long)&pVVar18->field_0 + 8) = lVar15;
      pVVar18 = patch->items[uVar24].ring.items[3].ring.data;
      *(long *)&pVVar18[2].field_0 = lVar14;
      *(long *)((long)&pVVar18[2].field_0 + 8) = lVar15;
      pVVar18 = patch->items[uVar24].ring.items[0].ring.data;
      uVar13 = *(undefined8 *)&pVVar18->field_0;
      uVar16 = *(undefined8 *)((long)&pVVar18->field_0 + 8);
      pVVar18 = *ppVVar22;
      *(undefined8 *)&pVVar18[5].field_0 = uVar13;
      *(undefined8 *)((long)&pVVar18[5].field_0 + 8) = uVar16;
      pVVar18 = patch->items[uVar24].ring.items[3].ring.data;
      *(undefined8 *)&pVVar18[1].field_0 = uVar13;
      *(undefined8 *)((long)&pVVar18[1].field_0 + 8) = uVar16;
      paVar17 = &patch->items[uVar24].ring;
      uVar13 = *(undefined8 *)&paVar17->items[0].vtx.field_0;
      uVar16 = *(undefined8 *)((long)&paVar17->items[0].vtx.field_0 + 8);
      pVVar18 = *ppVVar22;
      *(undefined8 *)&pVVar18[4].field_0 = uVar13;
      *(undefined8 *)((long)&pVVar18[4].field_0 + 8) = uVar16;
      pVVar18 = patch->items[uVar24].ring.items[3].ring.data;
      *(undefined8 *)&pVVar18->field_0 = uVar13;
      *(undefined8 *)((long)&pVVar18->field_0 + 8) = uVar16;
      puVar5 = (undefined8 *)((long)ppVVar22[-0x68] + 0x10 + (long)(int)ppVVar22[-200] * 0x10);
      uVar13 = *puVar5;
      uVar16 = puVar5[1];
      pVVar18 = *ppVVar22;
      *(undefined8 *)&pVVar18[3].field_0 = uVar13;
      *(undefined8 *)((long)&pVVar18[3].field_0 + 8) = uVar16;
      pVVar18 = patch->items[uVar24].ring.items[3].ring.data;
      *(undefined8 *)&pVVar18[5].field_0 = uVar13;
      *(undefined8 *)((long)&pVVar18[5].field_0 + 8) = uVar16;
      lVar14 = (long)ppVVar22[-0xae];
      lVar15 = (long)ppVVar22[-0xad];
      pVVar18 = *ppVVar22;
      *(long *)&pVVar18[2].field_0 = lVar14;
      *(long *)((long)&pVVar18[2].field_0 + 8) = lVar15;
      pVVar18 = patch->items[uVar24].ring.items[3].ring.data;
      *(long *)&pVVar18[4].field_0 = lVar14;
      *(long *)((long)&pVVar18[4].field_0 + 8) = lVar15;
      uVar13 = *(undefined8 *)((long)ppVVar22[-0x68] + 0x20);
      uVar16 = *(undefined8 *)((long)ppVVar22[-0x68] + 0x28);
      pVVar18 = *ppVVar22;
      *(undefined8 *)&pVVar18[1].field_0 = uVar13;
      *(undefined8 *)((long)&pVVar18[1].field_0 + 8) = uVar16;
      pVVar18 = patch->items[uVar24].ring.items[3].ring.data;
      *(undefined8 *)&pVVar18[3].field_0 = uVar13;
      *(undefined8 *)((long)&pVVar18[3].field_0 + 8) = uVar16;
      *(undefined4 *)ppVVar22[-0x50] = 0;
      patch->items[uVar24].ring.items[3].crease_weight.data[1] = 0.0;
      pCVar34 = patch->items + uVar24;
      fVar49 = patch->items[uVar24].ring.items[0].crease_weight.data[1];
      *(float *)((long)ppVVar22[-0x50] + 8) = fVar49;
      *patch->items[uVar24].ring.items[3].crease_weight.data = fVar49;
      fVar49 = *(float *)ppVVar22[-0xb8];
      *(float *)((long)ppVVar22[-0x50] + 4) = fVar49;
      patch->items[uVar24].ring.items[3].crease_weight.data[2] = fVar49;
      uVar28 = *(uint *)((long)ppVVar22 + -0x574);
      uVar25 = patch->items[uVar24].ring.items[0].eval_unique_identifier;
      if (uVar28 <= uVar25) {
        *(undefined4 *)(ppVVar22 + -0x47) = 1;
        (pCVar34->ring).items[3].eval_start_index = 2;
        goto LAB_005f11b6;
      }
      *(undefined4 *)(ppVVar22 + -0x47) = 2;
      (pCVar34->ring).items[3].eval_start_index = 0;
LAB_005f117e:
      *(uint *)((long)ppVVar22 + -0x234) = uVar25;
      (pCVar34->ring).items[3].eval_unique_identifier = uVar25;
    }
    else {
      *(float *)(ppVVar22 + -0x48) = *(float *)((long)ppVVar22 + -0x57c);
      patch->items[uVar24].ring.items[3].vertex_level = *(float *)((long)ppVVar22 + -0x57c);
      *(undefined4 *)((long)ppVVar22 + -0x2fc) = 4;
      patch->items[uVar24].ring.items[3].face_valence = 4;
      *(undefined4 *)(ppVVar22 + -0x5f) = 8;
      patch->items[uVar24].ring.items[3].edge_valence = 8;
      *(undefined4 *)(ppVVar22 + -0x60) = 0xffffffff;
      patch->items[uVar24].ring.items[3].border_index = -1;
      plVar10 = (long *)ppVVar22[-0x68];
      lVar14 = *plVar10;
      lVar15 = plVar10[1];
      ppVVar22[-0x46] = (Vec3fa *)lVar14;
      ppVVar22[-0x45] = (Vec3fa *)lVar15;
      paVar17 = &patch->items[uVar24].ring;
      *(long *)&paVar17->items[3].vtx.field_0 = lVar14;
      *(long *)((long)&paVar17->items[3].vtx.field_0 + 8) = lVar15;
      *(undefined4 *)((long)ppVVar22 + -0x2f4) = 0;
      patch->items[uVar24].ring.items[3].vertex_crease_weight = 0.0;
      lVar14 = plVar10[2];
      lVar15 = plVar10[3];
      pVVar18 = *ppVVar22;
      *(long *)&pVVar18->field_0 = lVar14;
      *(long *)((long)&pVVar18->field_0 + 8) = lVar15;
      pVVar18 = patch->items[uVar24].ring.items[3].ring.data;
      *(long *)&pVVar18[2].field_0 = lVar14;
      *(long *)((long)&pVVar18[2].field_0 + 8) = lVar15;
      pVVar18 = patch->items[uVar24].ring.items[0].ring.data;
      uVar13 = *(undefined8 *)&pVVar18->field_0;
      uVar16 = *(undefined8 *)((long)&pVVar18->field_0 + 8);
      pVVar18 = *ppVVar22;
      *(undefined8 *)&pVVar18[7].field_0 = uVar13;
      *(undefined8 *)((long)&pVVar18[7].field_0 + 8) = uVar16;
      pVVar18 = patch->items[uVar24].ring.items[3].ring.data;
      *(undefined8 *)&pVVar18[1].field_0 = uVar13;
      *(undefined8 *)((long)&pVVar18[1].field_0 + 8) = uVar16;
      paVar17 = &patch->items[uVar24].ring;
      uVar13 = *(undefined8 *)&paVar17->items[0].vtx.field_0;
      uVar16 = *(undefined8 *)((long)&paVar17->items[0].vtx.field_0 + 8);
      pVVar18 = *ppVVar22;
      *(undefined8 *)&pVVar18[6].field_0 = uVar13;
      *(undefined8 *)((long)&pVVar18[6].field_0 + 8) = uVar16;
      pVVar18 = patch->items[uVar24].ring.items[3].ring.data;
      *(undefined8 *)&pVVar18->field_0 = uVar13;
      *(undefined8 *)((long)&pVVar18->field_0 + 8) = uVar16;
      pVVar18 = patch->items[uVar24].ring.items[0].ring.data;
      uVar13 = *(undefined8 *)&pVVar18[4].field_0;
      uVar16 = *(undefined8 *)((long)&pVVar18[4].field_0 + 8);
      pVVar18 = *ppVVar22;
      *(undefined8 *)&pVVar18[5].field_0 = uVar13;
      *(undefined8 *)((long)&pVVar18[5].field_0 + 8) = uVar16;
      pVVar18 = patch->items[uVar24].ring.items[3].ring.data;
      *(undefined8 *)&pVVar18[7].field_0 = uVar13;
      *(undefined8 *)((long)&pVVar18[7].field_0 + 8) = uVar16;
      puVar5 = (undefined8 *)((long)ppVVar22[-0x68] + (ulong)((int)ppVVar22[-199] - 1) * 0x10);
      uVar13 = *puVar5;
      uVar16 = puVar5[1];
      pVVar18 = *ppVVar22;
      *(undefined8 *)&pVVar18[4].field_0 = uVar13;
      *(undefined8 *)((long)&pVVar18[4].field_0 + 8) = uVar16;
      pVVar18 = patch->items[uVar24].ring.items[3].ring.data;
      *(undefined8 *)&pVVar18[6].field_0 = uVar13;
      *(undefined8 *)((long)&pVVar18[6].field_0 + 8) = uVar16;
      puVar5 = (undefined8 *)((long)ppVVar22[-0x68] + (ulong)((int)ppVVar22[-199] - 2) * 0x10);
      uVar13 = *puVar5;
      uVar16 = puVar5[1];
      pVVar18 = *ppVVar22;
      *(undefined8 *)&pVVar18[3].field_0 = uVar13;
      *(undefined8 *)((long)&pVVar18[3].field_0 + 8) = uVar16;
      pVVar18 = patch->items[uVar24].ring.items[3].ring.data;
      *(undefined8 *)&pVVar18[5].field_0 = uVar13;
      *(undefined8 *)((long)&pVVar18[5].field_0 + 8) = uVar16;
      lVar14 = (long)ppVVar22[-0xae];
      lVar15 = (long)ppVVar22[-0xad];
      pVVar18 = *ppVVar22;
      *(long *)&pVVar18[2].field_0 = lVar14;
      *(long *)((long)&pVVar18[2].field_0 + 8) = lVar15;
      pVVar18 = patch->items[uVar24].ring.items[3].ring.data;
      *(long *)&pVVar18[4].field_0 = lVar14;
      *(long *)((long)&pVVar18[4].field_0 + 8) = lVar15;
      uVar13 = *(undefined8 *)((long)ppVVar22[-0x68] + 0x20);
      uVar16 = *(undefined8 *)((long)ppVVar22[-0x68] + 0x28);
      pVVar18 = *ppVVar22;
      *(undefined8 *)&pVVar18[1].field_0 = uVar13;
      *(undefined8 *)((long)&pVVar18[1].field_0 + 8) = uVar16;
      pVVar18 = patch->items[uVar24].ring.items[3].ring.data;
      *(undefined8 *)&pVVar18[3].field_0 = uVar13;
      *(undefined8 *)((long)&pVVar18[3].field_0 + 8) = uVar16;
      *(undefined4 *)ppVVar22[-0x50] = 0;
      patch->items[uVar24].ring.items[3].crease_weight.data[1] = 0.0;
      pCVar34 = patch->items + uVar24;
      fVar49 = patch->items[uVar24].ring.items[0].crease_weight.data[1];
      *(float *)((long)ppVVar22[-0x50] + 0xc) = fVar49;
      *patch->items[uVar24].ring.items[3].crease_weight.data = fVar49;
      *(undefined4 *)((long)ppVVar22[-0x50] + 8) = 0;
      patch->items[uVar24].ring.items[3].crease_weight.data[3] = 0.0;
      fVar49 = *(float *)ppVVar22[-0xb8];
      *(float *)((long)ppVVar22[-0x50] + 4) = fVar49;
      patch->items[uVar24].ring.items[3].crease_weight.data[2] = fVar49;
      uVar28 = *(uint *)((long)ppVVar22 + -0x574);
      uVar25 = patch->items[uVar24].ring.items[0].eval_unique_identifier;
      if (uVar25 < uVar28) {
        *(undefined4 *)(ppVVar22 + -0x47) = 1;
        (pCVar34->ring).items[3].eval_start_index = 2;
        goto LAB_005f117e;
      }
      *(undefined4 *)(ppVVar22 + -0x47) = 3;
      (pCVar34->ring).items[3].eval_start_index = 0;
LAB_005f11b6:
      *(uint *)((long)ppVVar22 + -0x234) = uVar28;
      (pCVar34->ring).items[3].eval_unique_identifier = uVar28;
    }
    pGVar9 = (this->ring).data;
    fVar49 = (pGVar9[(ulong)(((int)uVar32 + uVar26) - 1) % (ulong)uVar26].edge_level +
             pGVar9[uVar24].edge_level) * 0.25;
    patch->items[uVar24].ring.items[2].edge_level = fVar49;
    *(float *)((long)ppVVar22 + -0x23c) = fVar49;
    if (fVar49 <= fVar36) {
      fVar49 = fVar36;
    }
    pfVar20 = (float *)((long)((((this->ring).data)->ring).arr + -4) + lVar19);
    auVar47._0_4_ = auVar41._0_4_ + *pfVar20;
    auVar47._4_4_ = auVar41._4_4_ + pfVar20[1];
    auVar47._8_4_ = auVar41._8_4_ + pfVar20[2];
    auVar47._12_4_ = auVar41._12_4_ + pfVar20[3];
    lVar14 = (long)ppVVar22[-0xad];
    *(Vec3fa **)&center_ring.items[uVar33 - 1].field_0 = ppVVar22[-0xae];
    *(long *)((long)&center_ring.items[uVar33 - 1].field_0 + 8) = lVar14;
    uVar13 = *(undefined8 *)((long)ppVVar22[-0x68] + 8);
    *(undefined8 *)&center_ring.items[uVar33].field_0 = *(undefined8 *)ppVVar22[-0x68];
    *(undefined8 *)((long)&center_ring.items[uVar33].field_0 + 8) = uVar13;
    uVar26 = this->N;
    uVar33 = uVar33 + 2;
    lVar19 = lVar19 + 0x380;
    ppVVar22 = ppVVar22 + 0x1a0;
    uVar32 = uVar27;
    auVar41 = auVar47;
    fVar36 = fVar49;
  } while( true );
}

Assistant:

__noinline void subdivide(array_t<CatmullClarkPatch,SIZE>& patch, unsigned& N_o) const
    {
      N_o = N;
      assert( N );
      for (unsigned i=0; i<N; i++) {
        unsigned ip1 = (i+1)%N; // FIXME: %
        ring[i].subdivide(patch[i].ring[0]);
        patch[i]  .ring[0].edge_level = 0.5f*ring[i].edge_level;
        patch[ip1].ring[3].edge_level = 0.5f*ring[i].edge_level;
        
	assert( patch[i].ring[0].hasValidPositions() );
        
      }
      assert(N < 2*SIZE);
      Vertex_t center = Vertex_t(0.0f);
      array_t<Vertex_t,2*SIZE> center_ring;
      float center_vertex_level = 2.0f; // guarantees that irregular vertices get always isolated also for non-quads
      
      for (unsigned i=0; i<N; i++)
      {
        unsigned ip1 = (i+1)%N; // FIXME: %
        unsigned im1 = (i+N-1)%N; // FIXME: %
        bool regular = ring[i].has_last_face() && ring[ip1].face_valence > 2;
        if (likely(regular)) init_regular(patch[i].ring[0],patch[ip1].ring[0],patch[i].ring[1],patch[ip1].ring[3]); 
        else                 init_border (patch[i].ring[0],patch[ip1].ring[0],patch[i].ring[1],patch[ip1].ring[3]);
        
	assert( patch[i].ring[1].hasValidPositions() );
	assert( patch[ip1].ring[3].hasValidPositions() );
        
	float level = 0.25f*(ring[im1].edge_level+ring[ip1].edge_level);
        patch[i].ring[1].edge_level = patch[ip1].ring[2].edge_level = level;
	center_vertex_level = max(center_vertex_level,level);
        
        center += ring[i].vtx;
        center_ring[2*i+0] = (Vertex_t)patch[i].ring[0].vtx;
        center_ring[2*i+1] = (Vertex_t)patch[i].ring[0].ring[0];
      }
      center /= float(N);
      
      for (unsigned int i=0; i<N; i++) {
        init_regular(center,center_ring,center_vertex_level,N,2*i,patch[i].ring[2]);
        
	assert( patch[i].ring[2].hasValidPositions() );
      }
    }